

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall
node::BlockManager::WriteUndoDataForBlock
          (BlockManager *this,CBlockUndo *blockundo,BlockValidationState *state,CBlockIndex *block)

{
  string_view source_file;
  string_view source_file_00;
  bool bVar1;
  BlockfileCursor *hashBlock;
  reference pvVar2;
  FlatFilePos *in_RCX;
  ConstevalStringLiteral in_RDX;
  BlockManager *in_RSI;
  ConstevalFormatString<1U> in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<CBlockIndex_*>,_bool> pVar3;
  Level unaff_retaddr;
  char (*in_stack_00000010) [22];
  BlockfileCursor *cursor;
  FlatFilePos _pos;
  BlockfileType type;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  char *in_stack_fffffffffffffe60;
  CBlockIndex *in_stack_fffffffffffffe68;
  BlockManager *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  uint uVar4;
  char *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  int line;
  char *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  LogFlags in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffecc;
  FlatFilePos *in_stack_fffffffffffffed0;
  BlockValidationState *in_stack_fffffffffffffed8;
  BlockManager *in_stack_fffffffffffffee0;
  CBlockUndo *blockundo_00;
  BlockManager *this_00;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  byte bVar5;
  char *in_stack_ffffffffffffff18;
  string_view in_stack_ffffffffffffff20;
  undefined1 local_a0 [36];
  BlockfileType local_7c;
  _Base_ptr local_78;
  undefined1 local_70;
  long local_8;
  
  line = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
             (AnnotatedMixin<std::recursive_mutex> *)0x37abc8);
  local_7c = BlockfileTypeForHeight
                       (in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_a0._24_8_ = &local_7c;
  WriteUndoDataForBlock::anon_class_16_2_3fe678f5::operator()
            ((anon_class_16_2_3fe678f5 *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  inline_assertion_check<true,std::optional<node::BlockfileCursor>&>
            ((optional<node::BlockfileCursor> *)
             CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),in_stack_fffffffffffffe90
             ,line,in_stack_fffffffffffffe80,
             (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  hashBlock = std::optional<node::BlockfileCursor>::operator*
                        ((optional<node::BlockfileCursor> *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_a0._8_8_ = CBlockIndex::GetUndoPos((CBlockIndex *)in_stack_fffffffffffffe60);
  bVar1 = FlatFilePos::IsNull((FlatFilePos *)
                              CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (bVar1) {
    FlatFilePos::FlatFilePos
              ((FlatFilePos *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    blockundo_00 = (CBlockUndo *)in_RDX.lit;
    GetSerializeSize<CBlockUndo>((CBlockUndo *)in_stack_fffffffffffffe60);
    bVar1 = FindUndoPos(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        (int)((ulong)hashBlock >> 0x20),in_stack_fffffffffffffed0,
                        in_stack_fffffffffffffecc);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (char *)in_stack_fffffffffffffe70);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (char *)in_stack_fffffffffffffe70);
      source_file._M_len._7_1_ = in_stack_ffffffffffffff17;
      source_file._M_len._0_7_ = in_stack_ffffffffffffff10;
      source_file._M_str = in_stack_ffffffffffffff18;
      LogPrintFormatInternal<char[22]>
                (in_stack_ffffffffffffff20,source_file,in_stack_fffffffffffffecc,
                 in_stack_fffffffffffffec0,unaff_retaddr,in_RDI,in_stack_00000010);
      bVar5 = 0;
      goto LAB_0037b00f;
    }
    this_00 = in_RSI;
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffe68);
    bVar1 = UndoWriteToDisk(this_00,blockundo_00,in_RCX,(uint256 *)hashBlock);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ::_(in_RDX);
      bVar5 = FatalError((Notifications *)in_stack_fffffffffffffe68,
                         (BlockValidationState *)in_stack_fffffffffffffe60,
                         (bilingual_str *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      goto LAB_0037b00f;
    }
    if ((int)local_a0._0_4_ < hashBlock->file_num) {
      uVar4 = in_RCX[3].nFile;
      pvVar2 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                         ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                          in_stack_fffffffffffffe68,(size_type)in_stack_fffffffffffffe60);
      if (uVar4 != pvVar2->nHeightLast) goto LAB_0037af6c;
      bVar1 = FlushUndoFile((BlockManager *)in_RDX.lit,(int)((ulong)in_RSI >> 0x20),
                            SUB81((ulong)in_RSI >> 0x18,0));
      if ((!bVar1) &&
         (bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                      Trace), bVar1)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar4,in_stack_fffffffffffffe78),(char *)in_stack_fffffffffffffe70);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar4,in_stack_fffffffffffffe78),(char *)in_stack_fffffffffffffe70);
        in_stack_fffffffffffffe68 = (CBlockIndex *)local_a0;
        in_stack_fffffffffffffe60 = "Failed to flush undo file %05i\n";
        source_file_00._M_len._7_1_ = in_stack_ffffffffffffff17;
        source_file_00._M_len._0_7_ = in_stack_ffffffffffffff10;
        source_file_00._M_str = in_stack_ffffffffffffff18;
        LogPrintFormatInternal<int>
                  (in_stack_ffffffffffffff20,source_file_00,in_stack_fffffffffffffecc,0x10dbb02,
                   unaff_retaddr,in_RDI,(int *)in_stack_00000010);
      }
    }
    else {
LAB_0037af6c:
      if ((local_a0._0_4_ == hashBlock->file_num) && (hashBlock->undo_height < in_RCX[3].nFile)) {
        hashBlock->undo_height = in_RCX[3].nFile;
      }
    }
    in_RCX[4].nPos = local_a0._4_4_;
    in_RCX[0xb].nFile = in_RCX[0xb].nFile | 0x10;
    pVar3 = std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::
            insert((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
                   in_stack_fffffffffffffe68,(value_type *)in_stack_fffffffffffffe60);
    local_78 = (_Base_ptr)pVar3.first._M_node;
    local_70 = pVar3.second;
  }
  bVar5 = 1;
LAB_0037b00f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool BlockManager::WriteUndoDataForBlock(const CBlockUndo& blockundo, BlockValidationState& state, CBlockIndex& block)
{
    AssertLockHeld(::cs_main);
    const BlockfileType type = BlockfileTypeForHeight(block.nHeight);
    auto& cursor = *Assert(WITH_LOCK(cs_LastBlockFile, return m_blockfile_cursors[type]));

    // Write undo information to disk
    if (block.GetUndoPos().IsNull()) {
        FlatFilePos _pos;
        if (!FindUndoPos(state, block.nFile, _pos, ::GetSerializeSize(blockundo) + 40)) {
            LogError("%s: FindUndoPos failed\n", __func__);
            return false;
        }
        if (!UndoWriteToDisk(blockundo, _pos, block.pprev->GetBlockHash())) {
            return FatalError(m_opts.notifications, state, _("Failed to write undo data."));
        }
        // rev files are written in block height order, whereas blk files are written as blocks come in (often out of order)
        // we want to flush the rev (undo) file once we've written the last block, which is indicated by the last height
        // in the block file info as below; note that this does not catch the case where the undo writes are keeping up
        // with the block writes (usually when a synced up node is getting newly mined blocks) -- this case is caught in
        // the FindNextBlockPos function
        if (_pos.nFile < cursor.file_num && static_cast<uint32_t>(block.nHeight) == m_blockfile_info[_pos.nFile].nHeightLast) {
            // Do not propagate the return code, a failed flush here should not
            // be an indication for a failed write. If it were propagated here,
            // the caller would assume the undo data not to be written, when in
            // fact it is. Note though, that a failed flush might leave the data
            // file untrimmed.
            if (!FlushUndoFile(_pos.nFile, true)) {
                LogPrintLevel(BCLog::BLOCKSTORAGE, BCLog::Level::Warning, "Failed to flush undo file %05i\n", _pos.nFile);
            }
        } else if (_pos.nFile == cursor.file_num && block.nHeight > cursor.undo_height) {
            cursor.undo_height = block.nHeight;
        }
        // update nUndoPos in block index
        block.nUndoPos = _pos.nPos;
        block.nStatus |= BLOCK_HAVE_UNDO;
        m_dirty_blockindex.insert(&block);
    }

    return true;
}